

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvpair.c
# Opt level: O3

uchar * nvpair_unpack_string_array(_Bool isbe,nvpair_t *nvp,uchar *ptr,size_t *leftp)

{
  bool bVar1;
  size_t sVar2;
  int *piVar3;
  void *__ptr;
  char *__s;
  ulong uVar4;
  uchar *__string;
  ulong uVar5;
  size_t sVar6;
  ulong uVar7;
  
  if (nvp->nvp_type != 10) {
    __assert_fail("nvp->nvp_type == 10",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Zer0-One[P]libnv-portable/src/nvpair.c"
                  ,0x3be,
                  "const unsigned char *nvpair_unpack_string_array(_Bool, nvpair_t *, const unsigned char *, size_t *)"
                 );
  }
  uVar4 = *leftp;
  sVar6 = nvp->nvp_datasize;
  if ((sVar6 - 1 < uVar4) && (uVar5 = nvp->nvp_nitems, uVar5 != 0)) {
    __string = ptr;
    uVar7 = 1;
    do {
      sVar2 = strnlen((char *)__string,sVar6 - 1);
      sVar6 = sVar6 - (sVar2 + 1);
      if ((long)sVar6 < 0) goto LAB_0010cf18;
      __string = __string + sVar2 + 1;
      bVar1 = uVar7 < uVar5;
      uVar7 = (ulong)((int)uVar7 + 1);
    } while (bVar1);
    if (sVar6 == 0) {
      __ptr = malloc(uVar5 << 3);
      uVar5 = 0;
      if (__ptr == (void *)0x0) {
        return (uchar *)0x0;
      }
      do {
        __s = strdup((char *)ptr);
        *(char **)((long)__ptr + uVar5 * 8) = __s;
        if (__s == (char *)0x0) {
          if ((int)uVar5 != 0) {
            uVar4 = 0;
            do {
              free(*(void **)((long)__ptr + uVar4 * 8));
              uVar4 = uVar4 + 1;
            } while (uVar5 != uVar4);
          }
          free(__ptr);
          return (uchar *)0x0;
        }
        sVar2 = strlen(__s);
        uVar4 = uVar4 - (sVar2 + 1);
        ptr = ptr + sVar2 + 1;
        *leftp = uVar4;
        uVar5 = (ulong)((int)uVar5 + 1);
      } while (uVar5 < nvp->nvp_nitems);
      nvp->nvp_data = (uint64_t)__ptr;
      return ptr;
    }
  }
LAB_0010cf18:
  piVar3 = __errno_location();
  *piVar3 = 0x16;
  return (uchar *)0x0;
}

Assistant:

const unsigned char *
nvpair_unpack_string_array(bool isbe __unused, nvpair_t *nvp,
    const unsigned char *ptr, size_t *leftp)
{
	ssize_t size;
	size_t len;
	const char *tmp;
	char **value;
	unsigned int ii, j;

	PJDLOG_ASSERT(nvp->nvp_type == NV_TYPE_STRING_ARRAY);

	if (*leftp < nvp->nvp_datasize || nvp->nvp_datasize == 0 ||
	    nvp->nvp_nitems == 0) {
		ERRNO_SET(EINVAL);
		return (NULL);
	}

	size = nvp->nvp_datasize;
	tmp = (const char *)ptr;
	for (ii = 0; ii < nvp->nvp_nitems; ii++) {
		len = strnlen(tmp, size - 1) + 1;
		size -= len;
		if (size < 0) {
			ERRNO_SET(EINVAL);
			return (NULL);
		}
		tmp += len;
	}
	if (size != 0) {
		ERRNO_SET(EINVAL);
		return (NULL);
	}

	value = nv_malloc(sizeof(*value) * nvp->nvp_nitems);
	if (value == NULL)
		return (NULL);

	for (ii = 0; ii < nvp->nvp_nitems; ii++) {
		value[ii] = nv_strdup((const char *)ptr);
		if (value[ii] == NULL)
			goto out;
		len = strlen(value[ii]) + 1;
		ptr += len;
		*leftp -= len;
	}
	nvp->nvp_data = (uint64_t)(uintptr_t)value;

	return (ptr);
out:
	for (j = 0; j < ii; j++)
		nv_free(value[j]);
	nv_free(value);
	return (NULL);
}